

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::ClipperBase::Reset(ClipperBase *this)

{
  TEdge *pTVar1;
  LocalMinima *pLVar2;
  TEdge **ppTVar3;
  
  pLVar2 = this->m_MinimaList;
  this->m_CurrentLM = pLVar2;
  if (pLVar2 != (LocalMinima *)0x0) {
    for (; pLVar2 != (LocalMinima *)0x0; pLVar2 = pLVar2->next) {
      ppTVar3 = &pLVar2->leftBound;
      while (pTVar1 = *ppTVar3, pTVar1 != (TEdge *)0x0) {
        pTVar1->xcurr = pTVar1->xbot;
        pTVar1->ycurr = pTVar1->ybot;
        pTVar1->side = esLeft;
        pTVar1->outIdx = -1;
        ppTVar3 = &pTVar1->nextInLML;
      }
      ppTVar3 = &pLVar2->rightBound;
      while (pTVar1 = *ppTVar3, pTVar1 != (TEdge *)0x0) {
        pTVar1->xcurr = pTVar1->xbot;
        pTVar1->ycurr = pTVar1->ybot;
        pTVar1->side = esRight;
        pTVar1->outIdx = -1;
        ppTVar3 = &pTVar1->nextInLML;
      }
    }
  }
  return;
}

Assistant:

void ClipperBase::Reset()
{
  m_CurrentLM = m_MinimaList;
  if( !m_CurrentLM ) return; //ie nothing to process

  //reset all edges ...
  LocalMinima* lm = m_MinimaList;
  while( lm )
  {
    TEdge* e = lm->leftBound;
    while( e )
    {
      e->xcurr = e->xbot;
      e->ycurr = e->ybot;
      e->side = esLeft;
      e->outIdx = -1;
      e = e->nextInLML;
    }
    e = lm->rightBound;
    while( e )
    {
      e->xcurr = e->xbot;
      e->ycurr = e->ybot;
      e->side = esRight;
      e->outIdx = -1;
      e = e->nextInLML;
    }
    lm = lm->next;
  }
}